

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropIndex(Parse *pParse,SrcList *pName,int ifExists)

{
  sqlite3 *db;
  Schema *pSVar1;
  Table *pTVar2;
  char *zArg3;
  int iVar3;
  Index *pIVar4;
  Db *pDVar5;
  Vdbe *p;
  long lVar6;
  long lVar7;
  char *pcVar8;
  Schema **ppSVar9;
  uint local_44;
  long local_40;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar3 = sqlite3ReadSchema(pParse), iVar3 == 0)) {
    pIVar4 = sqlite3FindIndex(db,pName->a[0].zName,pName->a[0].zDatabase);
    if (pIVar4 == (Index *)0x0) {
      if (ifExists == 0) {
        sqlite3ErrorMsg(pParse,"no such index: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      }
      pParse->checkSchema = '\x01';
    }
    else if ((pIVar4->field_0x63 & 3) == 0) {
      pDVar5 = db->aDb;
      if (pIVar4->pSchema == (Schema *)0x0) {
        pDVar5 = pDVar5 + -1000000;
        pcVar8 = "sqlite_master";
        local_44 = 0xfff0bdc0;
        local_40 = -1000000;
      }
      else {
        lVar6 = -0x100000000;
        lVar7 = 0;
        ppSVar9 = &pDVar5->pSchema;
        do {
          lVar6 = lVar6 + 0x100000000;
          lVar7 = lVar7 + -1;
          pSVar1 = *ppSVar9;
          ppSVar9 = ppSVar9 + 4;
        } while (pSVar1 != pIVar4->pSchema);
        local_44 = ~(uint)lVar7;
        local_40 = lVar6 >> 0x20;
        pDVar5 = (Db *)((long)&pDVar5->zDbSName + (lVar6 >> 0x1b));
        pcVar8 = "sqlite_master";
        if (lVar7 == -2) {
          pcVar8 = "sqlite_temp_master";
        }
      }
      pTVar2 = pIVar4->pTable;
      zArg3 = pDVar5->zDbSName;
      iVar3 = sqlite3AuthCheck(pParse,9,pcVar8,(char *)0x0,zArg3);
      if (((iVar3 == 0) &&
          (iVar3 = sqlite3AuthCheck(pParse,(uint)(local_44 != 0) * 2 + 10,pIVar4->zName,
                                    pTVar2->zName,zArg3), iVar3 == 0)) &&
         (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
        sqlite3BeginWriteOperation(pParse,1,local_44);
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'index\'",
                           db->aDb[local_40].zDbSName,"sqlite_master",pIVar4->zName);
        sqlite3ClearStatTables(pParse,local_44,"idx",pIVar4->zName);
        sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,local_44,1,
                          (pParse->db->aDb[local_40].pSchema)->schema_cookie + 1);
        destroyRootPage(pParse,pIVar4->tnum,local_44);
        pcVar8 = pIVar4->zName;
        iVar3 = sqlite3VdbeAddOp3(p,0x90,local_44,0,0);
        sqlite3VdbeChangeP4(p,iVar3,pcVar8,0);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,
                      "index associated with UNIQUE or PRIMARY KEY constraint cannot be dropped",0);
    }
  }
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropIndex(Parse *pParse, SrcList *pName, int ifExists){
  Index *pIndex;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  assert( pParse->nErr==0 );   /* Never called with prior errors */
  if( db->mallocFailed ){
    goto exit_drop_index;
  }
  assert( pName->nSrc==1 );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_drop_index;
  }
  pIndex = sqlite3FindIndex(db, pName->a[0].zName, pName->a[0].zDatabase);
  if( pIndex==0 ){
    if( !ifExists ){
      sqlite3ErrorMsg(pParse, "no such index: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    }
    pParse->checkSchema = 1;
    goto exit_drop_index;
  }
  if( pIndex->idxType!=SQLITE_IDXTYPE_APPDEF ){
    sqlite3ErrorMsg(pParse, "index associated with UNIQUE "
      "or PRIMARY KEY constraint cannot be dropped", 0);
    goto exit_drop_index;
  }
  iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_INDEX;
    Table *pTab = pIndex->pTable;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      goto exit_drop_index;
    }
    if( !OMIT_TEMPDB && iDb ) code = SQLITE_DROP_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, code, pIndex->zName, pTab->zName, zDb) ){
      goto exit_drop_index;
    }
  }
#endif

  /* Generate code to remove the index and from the master table */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='index'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pIndex->zName
    );
    sqlite3ClearStatTables(pParse, iDb, "idx", pIndex->zName);
    sqlite3ChangeCookie(pParse, iDb);
    destroyRootPage(pParse, pIndex->tnum, iDb);
    sqlite3VdbeAddOp4(v, OP_DropIndex, iDb, 0, 0, pIndex->zName, 0);
  }

exit_drop_index:
  sqlite3SrcListDelete(db, pName);
}